

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

bool __thiscall
DReachabilityPropagator::correctDominator
          (DReachabilityPropagator *this,int r,vector<bool,_std::allocator<bool>_> *v,int avoid)

{
  uint uVar1;
  pointer pvVar2;
  uint *puVar3;
  BoolView *pBVar4;
  bool bVar5;
  size_type __n;
  ulong uVar6;
  uint *puVar7;
  reference rVar8;
  
  if (r != avoid) {
    __n = (size_type)r;
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](v,__n);
    *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
    pvVar2 = (this->ou).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (uint *)pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar7 = *(uint **)&pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data; puVar7 != puVar3; puVar7 = puVar7 + 1) {
      uVar1 = *puVar7;
      pBVar4 = (this->super_GraphPropagator).es.data;
      if ((sat.assigns.data[(uint)pBVar4[uVar1].v] == '\0') ||
         (bVar5 = BoolView::isFalse(pBVar4 + uVar1), !bVar5)) {
        pBVar4 = (this->super_GraphPropagator).vs.data;
        uVar1 = *(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + 4);
        uVar6 = (ulong)uVar1;
        if (sat.assigns.data[(uint)pBVar4[uVar6].v] == '\0') {
          if (uVar1 != avoid) goto LAB_001a4a8b;
        }
        else {
          bVar5 = BoolView::isFalse(pBVar4 + uVar6);
          if (uVar1 != avoid && !bVar5) {
LAB_001a4a8b:
            rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](v,(long)(int)uVar1);
            if ((*rVar8._M_p & rVar8._M_mask) == 0) {
              (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0xf])
                        (this,uVar6,v,(ulong)(uint)avoid);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool DReachabilityPropagator::correctDominator(int r, std::vector<bool>& v, int avoid) {
	if (r == avoid) {
		return true;
	}
	v[r] = true;
	if (DEBUG) {
		std::cout << "Visiting " << r << " " << avoid << " who is "
							<< (getNodeVar(r).isFixed() ? (getNodeVar(r).isTrue() ? "in" : "out") : "unfixed")
							<< '\n';
	}
	for (const int e : ou[r]) {
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			continue;
		}
		const int o = getHead(e);
		if (getNodeVar(o).isFixed() && getNodeVar(o).isFalse()) {
			continue;
		}
		if (o == avoid) {
			continue;
		}
		if (v[o]) {
			continue;
		}
		correctDominator(o, v, avoid);
	}
	return true;
}